

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall
SVGChart::BarDataDrawer::DrawOnlyLastPoint
          (BarDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Trafo *pTVar5;
  long lVar6;
  ulong uVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  
  lVar3 = inRect->mX;
  lVar4 = inRect->mW;
  iVar1 = (this->super_DataDrawerBase).mPlotCount;
  iVar2 = (this->super_DataDrawerBase).mPlotIndex;
  (*((this->super_DataDrawerBase).mYTrafo)->_vptr_Trafo[2])(0);
  lVar6 = PlotDataBase::GetSize(inXData);
  if (0 < lVar6) {
    uVar7 = lVar4 / (long)iVar1;
    pTVar5 = (this->super_DataDrawerBase).mYTrafo;
    PlotDataBase::GetValue(inYData,lVar6 + -1);
    (*pTVar5->_vptr_Trafo[2])(pTVar5);
    (*inPainter->_vptr_Painter[1])
              (inPainter,(ulong)(uint)((int)lVar3 + iVar2 * (int)uVar7),
               (ulong)(uint)(int)extraout_XMM0_Da_00,uVar7 & 0xffffffff,
               (ulong)(uint)((int)extraout_XMM0_Da - (int)extraout_XMM0_Da_00));
  }
  return true;
}

Assistant:

bool BarDataDrawer::DrawOnlyLastPoint (const PlotDataBase &inXData, const PlotDataBase &inYData, [[maybe_unused]] const PlotDataSelection &inPlotDataSelection, [[maybe_unused]] const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {

      PRect theRect = inRect;
      theRect.mW = inRect.mW / mPlotCount;
      theRect.mX = inRect.mX + mPlotIndex * theRect.mW;

      int /*theTraX,*/ theTraY;
      int theTraY0 = mYTrafo->Transform (0);

      int theLeft, theTop, theWidth, theHeight;

      theWidth = theRect.mW;
      
      // only draw last point:
      long theI = inXData.GetSize () - 1;
      if (theI >= 0) {
        //theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        theTraY = mYTrafo->Transform (inYData.GetValue (theI));

        theLeft = theRect.mX;
        theTop = theTraY;
        theHeight = theTraY0-theTop;

        inPainter.FillRect (theLeft, theTop, theWidth, theHeight);
      }
      return true;
    }